

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithru.c
# Opt level: O0

void process_midi(PtTimestamp timestamp,void *userData)

{
  uint uVar1;
  PmError PVar2;
  int iVar3;
  PmError PVar4;
  uint *puVar5;
  int status_1;
  PmEvent *next;
  PmError rslt;
  int status;
  PmEvent buffer;
  PmError result;
  void *userData_local;
  PtTimestamp timestamp_local;
  
  current_timestamp = current_timestamp + 1;
  if (active == 0) {
    process_midi_exit_flag = 1;
  }
  else {
    unique0x1000019f = userData;
    if (app_sysex_in_progress == 0) {
      do {
        buffer.message = Pm_Poll(midi_in);
        if ((buffer.message != pmNoData) &&
           (iVar3 = Pm_Read(midi_in,(PmEvent *)&rslt,1), PVar2 = rslt, iVar3 != -0x270c)) {
          if (iVar3 != 1) {
            __assert_fail("rslt == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                          ,0x8b,"void process_midi(PtTimestamp, void *)");
          }
          last_timestamp = current_timestamp;
          PVar4 = rslt & 0xff;
          if (((rslt & 0x80) != pmNoData) || (thru_sysex_in_progress != 0)) {
            Pm_Write(midi_out,(PmEvent *)&rslt,1);
            Pm_Enqueue(in_queue,&rslt);
            if (PVar4 == 0xf0) {
              thru_sysex_in_progress = 1;
            }
            else if ((PVar2 & 0xf8) != 0xf8) {
              thru_sysex_in_progress = 0;
            }
            if ((thru_sysex_in_progress != 0) &&
               (((((rslt & 0xff) == 0xf7 || ((rslt >> 8 & 0xffU) == 0xf7)) ||
                 ((rslt >> 0x10 & 0xffU) == 0xf7)) || ((rslt >> 0x18 & 0xffU) == 0xf7)))) {
              thru_sysex_in_progress = 0;
            }
          }
        }
      } while (buffer.message != 0);
    }
    while (iVar3 = Pm_QueueEmpty(out_queue), iVar3 == 0) {
      puVar5 = (uint *)Pm_QueuePeek(out_queue);
      if (puVar5 == (uint *)0x0) {
        __assert_fail("next",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                      ,0xbd,"void process_midi(PtTimestamp, void *)");
      }
      if (current_timestamp < (int)puVar5[1]) {
        return;
      }
      uVar1 = *puVar5;
      if (((uVar1 & 0xf8) != 0xf8) && (thru_sysex_in_progress != 0)) {
        if (current_timestamp <= last_timestamp + 5000) {
          return;
        }
        thru_sysex_in_progress = 0;
      }
      Pm_Dequeue(out_queue,&rslt);
      Pm_Write(midi_out,(PmEvent *)&rslt,1);
      if ((uVar1 & 0xff) == 0xf0) {
        app_sysex_in_progress = 1;
      }
      else if ((uVar1 & 0xf8) != 0xf8) {
        app_sysex_in_progress = 0;
      }
      if ((app_sysex_in_progress != 0) &&
         ((((rslt & 0xff) == 0xf7 || ((rslt >> 8 & 0xffU) == 0xf7)) ||
          (((rslt >> 0x10 & 0xffU) == 0xf7 || ((rslt >> 0x18 & 0xffU) == 0xf7)))))) {
        app_sysex_in_progress = 0;
      }
    }
  }
  return;
}

Assistant:

void process_midi(PtTimestamp timestamp, void *userData)
{
    PmError result;
    PmEvent buffer; /* just one message at a time */

    current_timestamp++; /* update every millisecond */
    /* if (current_timestamp % 1000 == 0) 
        printf("time %d\n", current_timestamp); */

    /* do nothing until initialization completes */
    if (!active) {
        /* this flag signals that no more midi processing will be done */
        process_midi_exit_flag = TRUE;
        return;
    }

    /* see if there is any midi input to process */
    if (!app_sysex_in_progress) {
        do {
            result = Pm_Poll(midi_in);
            if (result) {
                int status;
                PmError rslt = Pm_Read(midi_in, &buffer, 1);
                if (rslt == pmBufferOverflow) 
                    continue;
                assert(rslt == 1);

                /* record timestamp of most recent data */
                last_timestamp = current_timestamp;

                /* the data might be the end of a sysex message that
                   has timed out, in which case we must ignore it.
                   It's a continuation of a sysex message if status
                   is actually a data byte (high-order bit is zero). */
                status = Pm_MessageStatus(buffer.message);
                if (((status & 0x80) == 0) && !thru_sysex_in_progress) {
                    continue; /* ignore this data */
                }

                /* implement midi thru */
                /* note that you could output to multiple ports or do other
                   processing here if you wanted
                 */
                /* printf("thru: %x\n", buffer.message); */
                Pm_Write(midi_out, &buffer, 1);

                /* send the message to the application */
                /* you might want to filter clock or active sense messages here
                   to avoid sending a bunch of junk to the application even if
                   you want to send it to MIDI THRU
                 */
                Pm_Enqueue(in_queue, &buffer);

                /* sysex processing */
                if (status == MIDI_SYSEX) thru_sysex_in_progress = TRUE;
                else if ((status & 0xF8) != 0xF8) {
                    /* not MIDI_SYSEX and not real-time, so */
                    thru_sysex_in_progress = FALSE;
                }
                if (thru_sysex_in_progress && /* look for EOX */
                    (((buffer.message & 0xFF) == MIDI_EOX) ||
                     (((buffer.message >> 8) & 0xFF) == MIDI_EOX) ||
                     (((buffer.message >> 16) & 0xFF) == MIDI_EOX) ||
                     (((buffer.message >> 24) & 0xFF) == MIDI_EOX))) {
                    thru_sysex_in_progress = FALSE;
                }
            }
        } while (result);
    }


    /* see if there is application midi data to process */
    while (!Pm_QueueEmpty(out_queue)) {
        /* see if it is time to output the next message */
        PmEvent *next = (PmEvent *) Pm_QueuePeek(out_queue);
        assert(next); /* must be non-null because queue is not empty */
        if (next->timestamp <= current_timestamp) {
            /* time to send a message, first make sure it's not blocked */
            int status = Pm_MessageStatus(next->message);
            if ((status & 0xF8) == 0xF8) {
                ; /* real-time messages are not blocked */
            } else if (thru_sysex_in_progress) {
                /* maybe sysex has timed out (output becomes unblocked) */
                if (last_timestamp + 5000 < current_timestamp) {
                    thru_sysex_in_progress = FALSE;
                } else break; /* output is blocked, so exit loop */
            }
            Pm_Dequeue(out_queue, &buffer);
            Pm_Write(midi_out, &buffer, 1);

            /* inspect message to update app_sysex_in_progress */
            if (status == MIDI_SYSEX) app_sysex_in_progress = TRUE;
            else if ((status & 0xF8) != 0xF8) {
                /* not MIDI_SYSEX and not real-time, so */
                app_sysex_in_progress = FALSE;
            }
            if (app_sysex_in_progress && /* look for EOX */
                (((buffer.message & 0xFF) == MIDI_EOX) ||
                 (((buffer.message >> 8) & 0xFF) == MIDI_EOX) ||
                 (((buffer.message >> 16) & 0xFF) == MIDI_EOX) ||
                 (((buffer.message >> 24) & 0xFF) == MIDI_EOX))) {
                app_sysex_in_progress = FALSE;
            }
        } else break; /* wait until indicated timestamp */
    }
}